

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  GCObject *v;
  TValue *in_RAX;
  TValue *fi;
  char *pcVar2;
  TValue *val;
  TValue *local_28;
  
  local_28 = in_RAX;
  fi = index2adr(L,funcindex);
  pcVar2 = aux_upvalue(fi,n,&local_28);
  if (pcVar2 != (char *)0x0) {
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    local_28->value = pTVar1[-1].value;
    local_28->tt = pTVar1[-1].tt;
    if (((3 < L->top->tt) && (v = (L->top->value).gc, ((v->gch).marked & 3) != 0)) &&
       (((((fi->value).gc)->gch).marked & 4) != 0)) {
      luaC_barrierf(L,(fi->value).gc,v);
    }
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val;
  StkId fi;
  lua_lock(L);
  fi = index2adr(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val);
  if (name) {
    L->top--;
    setobj(L, val, L->top);
    luaC_barrier(L, clvalue(fi), L->top);
  }
  lua_unlock(L);
  return name;
}